

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xmlerror(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int test_ret_1;
  int test_ret;
  int iVar5;
  uint uVar6;
  bool bVar7;
  int test_ret_2;
  
  if (quiet == '\0') {
    puts("Testing xmlerror : 7 of 18 functions ...");
  }
  bVar7 = true;
  iVar5 = 0;
  while (bVar7) {
    iVar1 = xmlMemBlocks();
    initGenericErrorDefaultFunc(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar7 = false;
    printf("Leak of %d blocks found in initGenericErrorDefaultFunc");
    iVar5 = iVar5 + 1;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  bVar7 = true;
LAB_0013920a:
  if (bVar7) {
    bVar7 = true;
    while (bVar7) {
      iVar2 = xmlMemBlocks();
      bVar7 = false;
      xmlCopyError(0,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 == iVar3) goto LAB_0013920a;
      xmlMemBlocks();
      bVar7 = false;
      printf("Leak of %d blocks found in xmlCopyError");
      iVar1 = iVar1 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    bVar7 = false;
    goto LAB_0013920a;
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar6 = 0; uVar6 != 2; uVar6 = uVar6 + 1) {
    iVar3 = xmlMemBlocks();
    xmlCtxtResetLastError();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtResetLastError",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d",(ulong)uVar6);
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  uVar6 = iVar1 + iVar2 + iVar5;
  bVar7 = true;
  while (bVar7) {
    iVar5 = xmlMemBlocks();
    xmlParserPrintFileContext(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar5 == iVar1) break;
    iVar1 = xmlMemBlocks();
    bVar7 = false;
    printf("Leak of %d blocks found in xmlParserPrintFileContext",(ulong)(uint)(iVar1 - iVar5));
    printf(" %d",0);
    putchar(10);
    uVar6 = uVar6 + 1;
  }
  function_tests = function_tests + 1;
  bVar7 = true;
  while (bVar7) {
    iVar5 = xmlMemBlocks();
    xmlParserPrintFileInfo(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar5 == iVar1) break;
    iVar1 = xmlMemBlocks();
    bVar7 = false;
    printf("Leak of %d blocks found in xmlParserPrintFileInfo",(ulong)(uint)(iVar1 - iVar5));
    printf(" %d",0);
    putchar(10);
    uVar6 = uVar6 + 1;
  }
  function_tests = function_tests + 1;
  bVar7 = true;
  while (bVar7) {
    iVar5 = xmlMemBlocks();
    xmlResetError(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar5 == iVar1) break;
    iVar1 = xmlMemBlocks();
    bVar7 = false;
    printf("Leak of %d blocks found in xmlResetError",(ulong)(uint)(iVar1 - iVar5));
    printf(" %d",0);
    putchar(10);
    uVar6 = uVar6 + 1;
  }
  function_tests = function_tests + 1;
  xmlResetLastError();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  if (uVar6 != 0) {
    printf("Module xmlerror: %d errors\n",(ulong)uVar6);
  }
  return uVar6;
}

Assistant:

static int
test_xmlerror(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlerror : 7 of 18 functions ...\n");
    test_ret += test_initGenericErrorDefaultFunc();
    test_ret += test_xmlCopyError();
    test_ret += test_xmlCtxtGetLastError();
    test_ret += test_xmlCtxtResetLastError();
    test_ret += test_xmlFormatError();
    test_ret += test_xmlGetLastError();
    test_ret += test_xmlParserError();
    test_ret += test_xmlParserPrintFileContext();
    test_ret += test_xmlParserPrintFileInfo();
    test_ret += test_xmlParserValidityError();
    test_ret += test_xmlParserValidityWarning();
    test_ret += test_xmlParserWarning();
    test_ret += test_xmlResetError();
    test_ret += test_xmlResetLastError();
    test_ret += test_xmlSetGenericErrorFunc();
    test_ret += test_xmlSetStructuredErrorFunc();
    test_ret += test_xmlThrDefSetGenericErrorFunc();
    test_ret += test_xmlThrDefSetStructuredErrorFunc();

    if (test_ret != 0)
	printf("Module xmlerror: %d errors\n", test_ret);
    return(test_ret);
}